

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picklpf.c
# Opt level: O2

void av1_pick_filter_level(YV12_BUFFER_CONFIG *sd,AV1_COMP *cpi,LPF_PICK_METHOD method)

{
  uint8_t uVar1;
  LOOPFILTER_CONTROL LVar2;
  int iVar3;
  aom_bit_depth_t aVar4;
  SequenceHeader *pSVar5;
  AV1_PRIMARY *pAVar6;
  RefCntBuffer *pRVar7;
  bool bVar8;
  byte bVar9;
  int16_t iVar10;
  int iVar11;
  int iVar12;
  int64_t iVar13;
  sbyte sVar14;
  int plane_1;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  int plane;
  ulong uVar23;
  int iVar24;
  int iVar26;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 local_78 [16];
  int64_t best_filter_sse [3];
  int64_t zero_filter_sse [3];
  
  pSVar5 = (cpi->common).seq_params;
  uVar1 = pSVar5->monochrome;
  iVar11 = 0;
  if ((cpi->oxcf).mode == '\x02') {
    iVar11 = (cpi->oxcf).algo_cfg.sharpness;
  }
  (cpi->common).lf.sharpness_level = iVar11;
  if (((((((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN) &&
         ((cpi->oxcf).q_cfg.aq_mode == '\x03')) && ((cpi->sf).rt_sf.skip_lf_screen != 0)) &&
       (iVar11 = av1_cyclic_refresh_disable_lf_cdef(cpi), iVar11 != 0)) ||
      ((LVar2 = (cpi->oxcf).algo_cfg.loopfilter_control, LVar2 == LOOPFILTER_NONE ||
       ((LVar2 == LOOPFILTER_REFERENCE && ((cpi->ppi->rtc_ref).non_reference_frame != 0)))))) ||
     (method == '\x04')) {
LAB_001ea2fc:
    (cpi->common).lf.filter_level[0] = 0;
    (cpi->common).lf.filter_level[1] = 0;
    return;
  }
  if (2 < method) {
    if ((cpi->oxcf).pass < AOM_RC_LAST_PASS) {
      uVar17 = 0x3f;
    }
    else {
      uVar17 = (uint)((cpi->ppi->twopass).section_intra_rating < 9) << 4 | 0x2f;
    }
    iVar10 = av1_ac_quant_QTX((cpi->common).quant_params.base_qindex,0,pSVar5->bit_depth);
    uVar16 = 0x2f02;
    if (iVar10 < 1) {
      if ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0) {
        uVar16 = 0x1781;
      }
      else {
        uVar16 = 0x1781;
        if (0x18c00 < (cpi->common).height * (cpi->common).width) {
          uVar16 = 0x2f02;
        }
      }
    }
    if (((((cpi->svc).number_temporal_layers < 2) || ((cpi->svc).temporal_layer_id != 0)) ||
        (0x18c00 < (cpi->common).height * (cpi->common).width)) ||
       ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0)) {
      uVar16 = uVar16 << ((cpi->sf).rt_sf.use_fast_fixed_part != 0);
    }
    else {
      uVar22 = (cpi->rc).frame_source_sad;
      if (uVar22 < 0x186a1) {
        if (50000 < uVar22) {
          uVar16 = (uVar16 >> 1) * 3;
        }
      }
      else {
        uVar16 = uVar16 * 2;
      }
    }
    iVar11 = (int)iVar10;
    aVar4 = pSVar5->bit_depth;
    if (aVar4 == AOM_BITS_8) {
      bVar9 = (cpi->common).current_frame.frame_type;
      iVar12 = uVar16 * iVar11 + 0xbedd3;
      if (bVar9 == 0) {
        iVar12 = iVar11 * 0x449b + -0x46ec6;
      }
      uVar16 = iVar12 >> 0x12;
    }
    else {
      if (aVar4 == AOM_BITS_10) {
        sVar14 = 0x14;
        iVar12 = 0x45f5d8;
      }
      else {
        if (aVar4 != AOM_BITS_12) {
          return;
        }
        sVar14 = 0x16;
        iVar12 = 0x117d75e;
      }
      uVar18 = iVar11 * 0x50f3 + iVar12 >> sVar14;
      bVar9 = (cpi->common).current_frame.frame_type;
      uVar16 = uVar18 - 4;
      if (bVar9 != 0) {
        uVar16 = uVar18;
      }
    }
    if ((int)uVar16 < (int)uVar17) {
      uVar17 = uVar16;
    }
    uVar18 = 0;
    if (-1 < (int)uVar16) {
      uVar18 = uVar17;
    }
    (cpi->common).lf.filter_level[0] = uVar18;
    (cpi->common).lf.filter_level[1] = uVar18;
    (cpi->common).lf.filter_level_u = uVar18;
    (cpi->common).lf.filter_level_v = uVar18;
    if ((bVar9 & 0xfd) == 0 || (cpi->oxcf).algo_cfg.loopfilter_control != LOOPFILTER_SELECTIVELY) {
      return;
    }
    if ((cpi->rc).high_source_sad != 0) {
      return;
    }
    if ((cpi->oxcf).tune_cfg.content != AOM_CONTENT_SCREEN) {
      if (6 < ((cpi->td).rd_counts.newmv_or_intra_blocks * 100) /
              (((cpi->common).height >> 2) * ((cpi->common).width >> 2))) {
        return;
      }
      if ((cpi->rc).frames_since_key < 6) {
        return;
      }
    }
    goto LAB_001ea2fc;
  }
  local_78 = (undefined1  [16])0x0;
  if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
    pAVar6 = cpi->ppi;
    local_78._0_4_ = pAVar6->filter_level[0];
    local_78._4_4_ = pAVar6->filter_level[1];
    local_78._8_4_ = pAVar6->filter_level_u;
    local_78._12_4_ = pAVar6->filter_level_v;
  }
  iVar11 = aom_realloc_frame_buffer
                     (&cpi->last_frame_uf,(cpi->common).width,(cpi->common).height,
                      pSVar5->subsampling_x,pSVar5->subsampling_y,(uint)pSVar5->use_highbitdepth,
                      (cpi->oxcf).border_in_pixels,(cpi->common).features.byte_alignment,
                      (aom_codec_frame_buffer_t *)0x0,(aom_get_frame_buffer_cb_fn_t)0x0,(void *)0x0,
                      false,0);
  if (iVar11 != 0) {
    aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                       "Failed to allocate last frame buffer");
  }
  zero_filter_sse[2] = 0;
  zero_filter_sse[0] = 0;
  zero_filter_sse[1] = 0;
  best_filter_sse[2] = 0;
  best_filter_sse[0] = 0;
  best_filter_sse[1] = 0;
  uVar22 = (ulong)((uint)(uVar1 == '\0') * 2 + 1);
  if (0 < (cpi->sf).lpf_sf.skip_loop_filter_using_filt_error) {
    for (uVar23 = 0; uVar22 != uVar23; uVar23 = uVar23 + 1) {
      iVar13 = aom_get_sse_plane(sd,&((cpi->common).cur_frame)->buf,(int)uVar23,
                                 (uint)((cpi->common).seq_params)->use_highbitdepth);
      zero_filter_sse[uVar23] = iVar13;
    }
  }
  uVar17 = (uint)(method == '\x02');
  iVar11 = search_filter_level(sd,cpi,uVar17,(int *)local_78,0,2,best_filter_sse);
  (cpi->common).lf.filter_level[1] = iVar11;
  (cpi->common).lf.filter_level[0] = iVar11;
  if (method != '\x01') {
    iVar11 = search_filter_level(sd,cpi,uVar17,(int *)local_78,0,0,best_filter_sse);
    (cpi->common).lf.filter_level[0] = iVar11;
    iVar11 = search_filter_level(sd,cpi,uVar17,(int *)local_78,0,1,best_filter_sse);
    (cpi->common).lf.filter_level[1] = iVar11;
  }
  if (uVar1 == '\0') {
    iVar11 = search_filter_level(sd,cpi,uVar17,(int *)local_78,1,0,best_filter_sse + 1);
    (cpi->common).lf.filter_level_u = iVar11;
    iVar12 = search_filter_level(sd,cpi,uVar17,(int *)local_78,2,0,best_filter_sse + 2);
    (cpi->common).lf.filter_level_v = iVar12;
    iVar11 = (cpi->common).lf.filter_level[1];
  }
  else {
    iVar12 = (cpi->common).lf.filter_level_v;
  }
  iVar15 = (cpi->common).lf.filter_level[0];
  iVar3 = (cpi->common).lf.filter_level_u;
  (cpi->common).lf.backup_filter_level[0] = iVar15;
  (cpi->common).lf.backup_filter_level[1] = iVar11;
  (cpi->common).lf.backup_filter_level_u = iVar3;
  (cpi->common).lf.backup_filter_level_v = iVar12;
  if ((cpi->sf).lpf_sf.adaptive_luma_loop_filter_skip < 1) {
LAB_001ea685:
    if (iVar15 != 0) {
      if ((iVar11 == 0) || ((cpi->sf).lpf_sf.skip_loop_filter_using_filt_error < 1))
      goto LAB_001ea6e9;
      bVar8 = true;
      for (uVar23 = 0; uVar22 != uVar23; uVar23 = uVar23 + 1) {
        bVar8 = (bool)(bVar8 & ((double)(zero_filter_sse[uVar23] - best_filter_sse[uVar23]) * 100.0)
                               / (double)zero_filter_sse[uVar23] < 2.0);
      }
      if (!bVar8) goto LAB_001ea6e9;
      goto LAB_001ea6df;
    }
  }
  else {
    lVar20 = 0;
    auVar25 = _DAT_00460310;
    while( true ) {
      iVar24 = auVar25._0_4_;
      iVar26 = auVar25._4_4_;
      if (lVar20 == 7) break;
      lVar21 = (long)(cpi->common).remapped_ref_idx[lVar20];
      if ((lVar21 != -1) &&
         (pRVar7 = (cpi->common).ref_frame_map[lVar21], pRVar7 != (RefCntBuffer *)0x0)) {
        uVar23 = *(ulong *)pRVar7->filter_level;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = uVar23;
        iVar19 = (int)(uVar23 >> 0x20);
        auVar29._0_4_ = -(uint)(iVar24 < (int)uVar23);
        auVar29._4_4_ = -(uint)(iVar26 < iVar19);
        auVar29._8_4_ = -(uint)(auVar25._8_4_ < 0);
        auVar29._12_4_ = -(uint)(auVar25._12_4_ < 0);
        auVar28._0_4_ = -(uint)((int)uVar23 == -1);
        auVar28._4_4_ = -(uint)(iVar19 == -1);
        auVar28._8_8_ = 0;
        auVar25 = auVar25 & auVar28 | ~auVar28 & (~auVar29 & auVar27 | auVar25 & auVar29);
      }
      lVar20 = lVar20 + 1;
    }
    uVar17 = (cpi->common).current_frame.pyramid_level;
    if (uVar17 < 2) goto LAB_001ea685;
    iVar19 = 0x20;
    if (uVar17 < 5) {
      iVar19 = (uint)(uVar17 == 4) * 8 + 8;
    }
    if ((iVar19 <= iVar3 || (iVar19 <= iVar11 || iVar19 <= iVar15)) || (iVar19 <= iVar12))
    goto LAB_001ea685;
    auVar25._0_4_ = -(uint)(iVar24 == 0);
    auVar25._4_4_ = -(uint)(iVar24 == 0);
    auVar25._8_4_ = -(uint)(iVar26 == 0);
    auVar25._12_4_ = -(uint)(iVar26 == 0);
    uVar17 = movmskpd(iVar12,auVar25);
    if (((uVar17 & 1) == 0) || ((byte)((byte)uVar17 >> 1) == 0)) goto LAB_001ea685;
LAB_001ea6df:
    (cpi->common).lf.filter_level[0] = 0;
    (cpi->common).lf.filter_level[1] = 0;
  }
  iVar15 = 0;
LAB_001ea6e9:
  pRVar7 = (cpi->common).cur_frame;
  pRVar7->filter_level[0] = iVar15;
  pRVar7->filter_level[1] = (cpi->common).lf.filter_level[1];
  return;
}

Assistant:

void av1_pick_filter_level(const YV12_BUFFER_CONFIG *sd, AV1_COMP *cpi,
                           LPF_PICK_METHOD method) {
  AV1_COMMON *const cm = &cpi->common;
  const SequenceHeader *const seq_params = cm->seq_params;
  const int num_planes = av1_num_planes(cm);
  struct loopfilter *const lf = &cm->lf;
  int disable_filter_rt_screen = 0;
  (void)sd;

  // Enable loop filter sharpness only for allintra encoding mode,
  // as frames do not have to serve as references to others
  lf->sharpness_level =
      cpi->oxcf.mode == ALLINTRA ? cpi->oxcf.algo_cfg.sharpness : 0;

  if (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN &&
      cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ &&
      cpi->sf.rt_sf.skip_lf_screen)
    disable_filter_rt_screen = av1_cyclic_refresh_disable_lf_cdef(cpi);

  if (disable_filter_rt_screen ||
      cpi->oxcf.algo_cfg.loopfilter_control == LOOPFILTER_NONE ||
      (cpi->oxcf.algo_cfg.loopfilter_control == LOOPFILTER_REFERENCE &&
       cpi->ppi->rtc_ref.non_reference_frame)) {
    lf->filter_level[0] = 0;
    lf->filter_level[1] = 0;
    return;
  }

  if (method == LPF_PICK_MINIMAL_LPF) {
    lf->filter_level[0] = 0;
    lf->filter_level[1] = 0;
  } else if (method >= LPF_PICK_FROM_Q) {
    const int min_filter_level = 0;
    const int max_filter_level = get_max_filter_level(cpi);
    const int q = av1_ac_quant_QTX(cm->quant_params.base_qindex, 0,
                                   seq_params->bit_depth);
    // based on tests result for rtc test set
    // 0.04590 boosted or 0.02295 non-booseted in 18-bit fixed point
    const int strength_boost_q_treshold = 0;
    int inter_frame_multiplier =
        (q > strength_boost_q_treshold ||
         (cpi->sf.rt_sf.use_nonrd_pick_mode &&
          cpi->common.width * cpi->common.height > 352 * 288))
            ? 12034
            : 6017;
    // Increase strength on base TL0 for temporal layers, for low-resoln,
    // based on frame source_sad.
    if (cpi->svc.number_temporal_layers > 1 &&
        cpi->svc.temporal_layer_id == 0 &&
        cpi->common.width * cpi->common.height <= 352 * 288 &&
        cpi->sf.rt_sf.use_nonrd_pick_mode) {
      if (cpi->rc.frame_source_sad > 100000)
        inter_frame_multiplier = inter_frame_multiplier << 1;
      else if (cpi->rc.frame_source_sad > 50000)
        inter_frame_multiplier = 3 * (inter_frame_multiplier >> 1);
    } else if (cpi->sf.rt_sf.use_fast_fixed_part) {
      inter_frame_multiplier = inter_frame_multiplier << 1;
    }
    // These values were determined by linear fitting the result of the
    // searched level for 8 bit depth:
    // Keyframes: filt_guess = q * 0.06699 - 1.60817
    // Other frames: filt_guess = q * inter_frame_multiplier + 2.48225
    //
    // And high bit depth separately:
    // filt_guess = q * 0.316206 + 3.87252
    int filt_guess;
    switch (seq_params->bit_depth) {
      case AOM_BITS_8:
        filt_guess =
            (cm->current_frame.frame_type == KEY_FRAME)
                ? ROUND_POWER_OF_TWO(q * 17563 - 421574, 18)
                : ROUND_POWER_OF_TWO(q * inter_frame_multiplier + 650707, 18);
        break;
      case AOM_BITS_10:
        filt_guess = ROUND_POWER_OF_TWO(q * 20723 + 4060632, 20);
        break;
      case AOM_BITS_12:
        filt_guess = ROUND_POWER_OF_TWO(q * 20723 + 16242526, 22);
        break;
      default:
        assert(0 &&
               "bit_depth should be AOM_BITS_8, AOM_BITS_10 "
               "or AOM_BITS_12");
        return;
    }
    if (seq_params->bit_depth != AOM_BITS_8 &&
        cm->current_frame.frame_type == KEY_FRAME)
      filt_guess -= 4;
    // TODO(chengchen): retrain the model for Y, U, V filter levels
    lf->filter_level[0] = clamp(filt_guess, min_filter_level, max_filter_level);
    lf->filter_level[1] = clamp(filt_guess, min_filter_level, max_filter_level);
    lf->filter_level_u = clamp(filt_guess, min_filter_level, max_filter_level);
    lf->filter_level_v = clamp(filt_guess, min_filter_level, max_filter_level);
    if (cpi->oxcf.algo_cfg.loopfilter_control == LOOPFILTER_SELECTIVELY &&
        !frame_is_intra_only(cm) && !cpi->rc.high_source_sad) {
      if (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN) {
        lf->filter_level[0] = 0;
        lf->filter_level[1] = 0;
      } else {
        const int num4x4 = (cm->width >> 2) * (cm->height >> 2);
        const int newmv_thresh = 7;
        const int distance_since_key_thresh = 5;
        if ((cpi->td.rd_counts.newmv_or_intra_blocks * 100 / num4x4) <
                newmv_thresh &&
            cpi->rc.frames_since_key > distance_since_key_thresh) {
          lf->filter_level[0] = 0;
          lf->filter_level[1] = 0;
        }
      }
    }
  } else {
    int last_frame_filter_level[4] = { 0 };
    if (!frame_is_intra_only(cm)) {
      last_frame_filter_level[0] = cpi->ppi->filter_level[0];
      last_frame_filter_level[1] = cpi->ppi->filter_level[1];
      last_frame_filter_level[2] = cpi->ppi->filter_level_u;
      last_frame_filter_level[3] = cpi->ppi->filter_level_v;
    }
    // The frame buffer last_frame_uf is used to store the non-loop filtered
    // reconstructed frame in search_filter_level().
    if (aom_realloc_frame_buffer(
            &cpi->last_frame_uf, cm->width, cm->height,
            seq_params->subsampling_x, seq_params->subsampling_y,
            seq_params->use_highbitdepth, cpi->oxcf.border_in_pixels,
            cm->features.byte_alignment, NULL, NULL, NULL, false, 0))
      aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate last frame buffer");

    int64_t zero_filter_sse[MAX_MB_PLANE] = { 0 };
    int64_t best_filter_sse[MAX_MB_PLANE] = { 0 };

    if (cpi->sf.lpf_sf.skip_loop_filter_using_filt_error >= 1) {
      for (int plane = 0; plane < num_planes; plane++) {
        zero_filter_sse[plane] = aom_get_sse_plane(
            sd, &cm->cur_frame->buf, plane, cm->seq_params->use_highbitdepth);
      }
    }

    lf->filter_level[0] = lf->filter_level[1] =
        search_filter_level(sd, cpi, method == LPF_PICK_FROM_SUBIMAGE,
                            last_frame_filter_level, 0, 2, &best_filter_sse[0]);
    if (method != LPF_PICK_FROM_FULL_IMAGE_NON_DUAL) {
      lf->filter_level[0] = search_filter_level(
          sd, cpi, method == LPF_PICK_FROM_SUBIMAGE, last_frame_filter_level, 0,
          0, &best_filter_sse[0]);
      lf->filter_level[1] = search_filter_level(
          sd, cpi, method == LPF_PICK_FROM_SUBIMAGE, last_frame_filter_level, 0,
          1, &best_filter_sse[0]);
    }

    if (num_planes > 1) {
      lf->filter_level_u = search_filter_level(
          sd, cpi, method == LPF_PICK_FROM_SUBIMAGE, last_frame_filter_level, 1,
          0, &best_filter_sse[1]);
      lf->filter_level_v = search_filter_level(
          sd, cpi, method == LPF_PICK_FROM_SUBIMAGE, last_frame_filter_level, 2,
          0, &best_filter_sse[2]);
    }

    lf->backup_filter_level[0] = lf->filter_level[0];
    lf->backup_filter_level[1] = lf->filter_level[1];
    lf->backup_filter_level_u = lf->filter_level_u;
    lf->backup_filter_level_v = lf->filter_level_v;

    if (cpi->sf.lpf_sf.adaptive_luma_loop_filter_skip >= 1) {
      int32_t min_ref_filter_level[2] = { MAX_LOOP_FILTER, MAX_LOOP_FILTER };
      // Find the minimum luma filter levels across all reference frames.
      for (int ref = LAST_FRAME; ref <= ALTREF_FRAME; ++ref) {
        const RefCntBuffer *const buf = get_ref_frame_buf(cm, ref);
        if (buf == NULL) continue;

        if (buf->filter_level[0] != -1)
          min_ref_filter_level[0] =
              AOMMIN(min_ref_filter_level[0], buf->filter_level[0]);
        if (buf->filter_level[1] != -1)
          min_ref_filter_level[1] =
              AOMMIN(min_ref_filter_level[1], buf->filter_level[1]);
      }

      // Reset luma filter levels to zero based on minimum filter levels of
      // reference frames and current frame's pyramid level.
      unsigned int pyramid_level = cm->current_frame.pyramid_level;
      if (pyramid_level > 1) {
        int filter_threshold;
        if (pyramid_level >= 5)
          filter_threshold = 32;
        else if (pyramid_level >= 4)
          filter_threshold = 16;
        else
          filter_threshold = 8;

        const bool reset_filter_level_y =
            lf->filter_level[0] < filter_threshold &&
            lf->filter_level[1] < filter_threshold &&
            lf->filter_level_u < filter_threshold &&
            lf->filter_level_v < filter_threshold &&
            min_ref_filter_level[0] == 0 && min_ref_filter_level[1] == 0;
        if (reset_filter_level_y) {
          lf->filter_level[0] = 0;
          lf->filter_level[1] = 0;
        }
      }
    }

    if (lf->filter_level[0] != 0 && lf->filter_level[1] != 0 &&
        cpi->sf.lpf_sf.skip_loop_filter_using_filt_error >= 1) {
      const double pct_improvement_thresh = 2.0;
      bool reset_filter_level_y = true;

      // Calculate the percentage improvement in SSE for each plane. This
      // measures the relative reduction in error when applying the filter
      // compared to no filtering.
      for (int plane = 0; plane < num_planes; plane++) {
        const double pct_improvement_sse =
            ((zero_filter_sse[plane] - best_filter_sse[plane]) * 100.0) /
            zero_filter_sse[plane];
        reset_filter_level_y &= pct_improvement_sse < pct_improvement_thresh;
      }

      if (reset_filter_level_y) {
        lf->filter_level[0] = 0;
        lf->filter_level[1] = 0;
      }
    }

    // Store the current frame's filter levels to be referenced
    // while determining the minimum filter level from reference frames.
    cm->cur_frame->filter_level[0] = lf->filter_level[0];
    cm->cur_frame->filter_level[1] = lf->filter_level[1];
  }
}